

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParallelSuite.cpp
# Opt level: O2

bool __thiscall
Test::ParallelSuite::run
          (ParallelSuite *this,Output *out,
          vector<Test::TestMethodInfo,_std::allocator<Test::TestMethodInfo>_> *selectedMethods,
          bool continueOnError)

{
  string *psVar1;
  int iVar2;
  SynchronizedOutput *this_00;
  future<bool> *result;
  future<bool> *this_01;
  undefined1 local_12c [20];
  ParallelSuite *local_118;
  undefined8 local_110;
  future<bool> local_108;
  vector<std::future<bool>,_std::allocator<std::future<bool>_>_> results;
  
  (this->super_Suite).continueAfterFail = continueOnError;
  local_12c._4_8_ = selectedMethods;
  this_00 = (SynchronizedOutput *)operator_new(0x38);
  SynchronizedOutput::SynchronizedOutput(this_00,out);
  (this->super_Suite).output = (Output *)this_00;
  psVar1 = &(this->super_Suite).suiteName;
  (*out->_vptr_Output[2])
            (out,psVar1,
             ((long)(this->super_Suite).testMethods.
                    super__Vector_base<Test::Suite::TestMethod,_std::allocator<Test::Suite::TestMethod>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->super_Suite).testMethods.
                   super__Vector_base<Test::Suite::TestMethod,_std::allocator<Test::Suite::TestMethod>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x60 & 0xffffffff);
  iVar2 = (*(this->super_Suite)._vptr_Suite[5])(this);
  if ((char)iVar2 != '\0') {
    if ((this->super_Suite).testMethods.
        super__Vector_base<Test::Suite::TestMethod,_std::allocator<Test::Suite::TestMethod>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        (this->super_Suite).testMethods.
        super__Vector_base<Test::Suite::TestMethod,_std::allocator<Test::Suite::TestMethod>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      Assertion::Assertion
                ((Assertion *)&results,(psVar1->_M_dataplus)._M_p,0,
                 "Any test-methods directly added to a parallel-suite are not executed!");
      (*out->_vptr_Output[8])(out,(Assertion *)&results);
      Assertion::~Assertion((Assertion *)&results);
    }
    (*(this->super_Suite)._vptr_Suite[6])(this);
  }
  (*out->_vptr_Output[3])
            (out,psVar1,
             ((long)(this->super_Suite).testMethods.
                    super__Vector_base<Test::Suite::TestMethod,_std::allocator<Test::Suite::TestMethod>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->super_Suite).testMethods.
                   super__Vector_base<Test::Suite::TestMethod,_std::allocator<Test::Suite::TestMethod>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x60 & 0xffffffff,0,0);
  std::vector<std::future<bool>,_std::allocator<std::future<bool>_>_>::vector
            (&results,(long)(this->super_Suite).subSuites.
                            super__Vector_base<std::shared_ptr<Test::Suite>,_std::allocator<std::shared_ptr<Test::Suite>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->super_Suite).subSuites.
                            super__Vector_base<std::shared_ptr<Test::Suite>,_std::allocator<std::shared_ptr<Test::Suite>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4,
             (allocator_type *)&local_108);
  for (local_12c._0_4_ = 0;
      this_01 = results.super__Vector_base<std::future<bool>,_std::allocator<std::future<bool>_>_>.
                _M_impl.super__Vector_impl_data._M_start,
      (ulong)(uint)local_12c._0_4_ <
      (ulong)((long)(this->super_Suite).subSuites.
                    super__Vector_base<std::shared_ptr<Test::Suite>,_std::allocator<std::shared_ptr<Test::Suite>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->super_Suite).subSuites.
                    super__Vector_base<std::shared_ptr<Test::Suite>,_std::allocator<std::shared_ptr<Test::Suite>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4);
      local_12c._0_4_ = local_12c._0_4_ + 1) {
    local_118 = (ParallelSuite *)runSuite;
    local_110 = 0;
    local_12c._12_8_ = this;
    std::
    async<bool(Test::ParallelSuite::*)(unsigned_int,std::vector<Test::TestMethodInfo,std::allocator<Test::TestMethodInfo>>const&),Test::ParallelSuite*,unsigned_int&,std::vector<Test::TestMethodInfo,std::allocator<Test::TestMethodInfo>>const&>
              ((launch)&local_108,(type *)0x1,&local_118,(uint *)(local_12c + 0xc),
               (vector<Test::TestMethodInfo,_std::allocator<Test::TestMethodInfo>_> *)local_12c);
    std::future<bool>::operator=
              (results.super__Vector_base<std::future<bool>,_std::allocator<std::future<bool>_>_>.
               _M_impl.super__Vector_impl_data._M_start + (uint)local_12c._0_4_,&local_108);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_108.super___basic_future<bool>._M_state.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  for (; this_01 !=
         results.super__Vector_base<std::future<bool>,_std::allocator<std::future<bool>_>_>._M_impl.
         super__Vector_impl_data._M_finish; this_01 = this_01 + 1) {
    std::future<bool>::get(this_01);
  }
  std::vector<std::future<bool>,_std::allocator<std::future<bool>_>_>::~vector(&results);
  return true;
}

Assistant:

bool ParallelSuite::run(Output &out, const std::vector<TestMethodInfo> &selectedMethods, bool continueOnError) {
  this->continueAfterFail = continueOnError;
  this->output = new SynchronizedOutput(out);
  out.initializeSuite(suiteName, static_cast<unsigned>(testMethods.size()));
  if (setup()) {
    // warn if test-methods are directly added
    if (!testMethods.empty()) {
      Assertion notEmptyAssterion(
          suiteName.c_str(), 0, "Any test-methods directly added to a parallel-suite are not executed!");
      out.printFailure(notEmptyAssterion);
    }
    // run tear-down after all tests
    tear_down();
  }
  out.finishSuite(suiteName, static_cast<unsigned>(testMethods.size()), 0, std::chrono::microseconds::zero());

  std::vector<std::future<bool>> results(subSuites.size());
  // run sub-suites
  for (unsigned int i = 0; i < subSuites.size(); i++) {
    results[i] = std::async(std::launch::async, &ParallelSuite::runSuite, this, i, selectedMethods);
  }

  // join sub-suites
  for (std::future<bool> &result : results) {
    result.get();
  }

  return true;
}